

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetExternalStream(cmUVProcessChainBuilder *this,Stream stdio,int fd)

{
  if (stdio - Stream_OUTPUT < 2) {
    (this->Stdio)._M_elems[stdio].Type = External;
    (this->Stdio)._M_elems[stdio].FileDescriptor = fd;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetExternalStream(
  Stream stdio, int fd)
{
  switch (stdio) {
    case Stream_INPUT:
      // FIXME
      break;

    case Stream_OUTPUT:
    case Stream_ERROR: {
      auto& streamData = this->Stdio[stdio];
      streamData.Type = External;
      streamData.FileDescriptor = fd;
      break;
    }
  }
  return *this;
}